

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void start_iterator(dmr_C *C,statement *stmt)

{
  symbol_list **ppsVar1;
  symbol *sym;
  symbol *sym_00;
  
  dmrC_start_symbol_scope(C);
  sym = dmrC_alloc_symbol(C->S,stmt->pos,3);
  dmrC_bind_symbol(C->S,sym,C->S->continue_ident,NS_ITERATOR);
  sym_00 = dmrC_alloc_symbol(C->S,stmt->pos,3);
  dmrC_bind_symbol(C->S,sym_00,C->S->break_ident,NS_ITERATOR);
  stmt->type = STMT_ITERATOR;
  (stmt->field_2).field_5.label_identifier = sym_00;
  (stmt->field_2).field_2.ret_target = sym;
  ppsVar1 = C->P->function_symbol_list;
  if (ppsVar1 != (symbol_list **)0x0) {
    ptrlist_add((ptr_list **)ppsVar1,sym_00,&C->ptrlist_allocator);
  }
  ppsVar1 = C->P->function_symbol_list;
  if (ppsVar1 != (symbol_list **)0x0) {
    ptrlist_add((ptr_list **)ppsVar1,sym,&C->ptrlist_allocator);
    return;
  }
  return;
}

Assistant:

static void start_iterator(struct dmr_C *C, struct statement *stmt)
{
	struct symbol *cont, *brk;

	dmrC_start_symbol_scope(C);
	cont = dmrC_alloc_symbol(C->S, stmt->pos, SYM_NODE);
	dmrC_bind_symbol(C->S, cont, C->S->continue_ident, NS_ITERATOR);
	brk = dmrC_alloc_symbol(C->S, stmt->pos, SYM_NODE);
	dmrC_bind_symbol(C->S, brk, C->S->break_ident, NS_ITERATOR);

	stmt->type = STMT_ITERATOR;
	stmt->iterator_break = brk;
	stmt->iterator_continue = cont;
	fn_local_symbol(C, brk);
	fn_local_symbol(C, cont);
}